

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_index.h
# Opt level: O0

void __thiscall S2CellIndex::CellIterator::CellIterator(CellIterator *this,S2CellIndex *index)

{
  bool bVar1;
  const_iterator cVar2;
  ostream *poVar3;
  S2LogMessage local_30;
  S2LogMessageVoidify local_19;
  S2CellIndex *local_18;
  S2CellIndex *index_local;
  CellIterator *this_local;
  
  local_18 = index;
  index_local = (S2CellIndex *)this;
  cVar2 = std::vector<S2CellIndex::CellNode,_std::allocator<S2CellIndex::CellNode>_>::begin
                    (&index->cell_tree_);
  (this->cell_it_)._M_current = cVar2._M_current;
  cVar2 = std::vector<S2CellIndex::CellNode,_std::allocator<S2CellIndex::CellNode>_>::end
                    (&local_18->cell_tree_);
  (this->cell_end_)._M_current = cVar2._M_current;
  bVar1 = std::vector<S2CellIndex::RangeNode,_std::allocator<S2CellIndex::RangeNode>_>::empty
                    (&local_18->range_nodes_);
  if (!bVar1) {
    return;
  }
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_index.h"
             ,0x1be,kFatal,(ostream *)&std::cerr);
  poVar3 = S2LogMessage::stream(&local_30);
  poVar3 = std::operator<<(poVar3,"Check failed: !index->range_nodes_.empty() ");
  poVar3 = std::operator<<(poVar3,"Call Build() first.");
  S2LogMessageVoidify::operator&(&local_19,poVar3);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_30);
}

Assistant:

inline S2CellIndex::CellIterator::CellIterator(const S2CellIndex* index)
    : cell_it_(index->cell_tree_.begin()),
      cell_end_(index->cell_tree_.end()) {
  S2_DCHECK(!index->range_nodes_.empty()) << "Call Build() first.";
}